

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_Pointer ft_mem_qalloc(FT_Memory memory,FT_Long size,FT_Error *p_error)

{
  void *local_30;
  FT_Pointer block;
  FT_Error error;
  FT_Error *p_error_local;
  FT_Long size_local;
  FT_Memory memory_local;
  
  block._4_4_ = 0;
  local_30 = (void *)0x0;
  if (size < 1) {
    if (size < 0) {
      block._4_4_ = 6;
    }
  }
  else {
    local_30 = (*memory->alloc)(memory,size);
    if (local_30 == (void *)0x0) {
      block._4_4_ = 0x40;
    }
  }
  *p_error = block._4_4_;
  return local_30;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_qalloc( FT_Memory  memory,
                 FT_Long    size,
                 FT_Error  *p_error )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Pointer  block = NULL;


    if ( size > 0 )
    {
      block = memory->alloc( memory, size );
      if ( !block )
        error = FT_THROW( Out_Of_Memory );
    }
    else if ( size < 0 )
    {
      /* may help catch/prevent security issues */
      error = FT_THROW( Invalid_Argument );
    }

    *p_error = error;
    return block;
  }